

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void __thiscall cppgenerate::Class::print(Class *this,ostream *output,bool headerOnly)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *this_00;
  reference pbVar4;
  ulong uVar5;
  long lVar6;
  CodeBlock *pCVar7;
  size_type sVar8;
  ostringstream *poVar9;
  reference pPVar10;
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [32];
  undefined1 local_358 [8];
  Parent parent;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_> *__range2;
  string local_2f0 [7];
  bool comma;
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  string local_260 [8];
  string include_1;
  _Self local_240;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string include;
  _Self local_208;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_1e0 [32];
  cppgenerate local_1c0 [8];
  string classNameUpper;
  undefined1 local_1a0 [8];
  CodeBlock block;
  bool headerOnly_local;
  ostream *output_local;
  Class *this_local;
  
  block._383_1_ = headerOnly;
  CodeBlock::CodeBlock((CodeBlock *)local_1a0);
  std::__cxx11::string::string(local_1e0,(string *)this);
  uppercase(local_1c0,(string *)local_1e0);
  std::__cxx11::string::~string(local_1e0);
  poVar3 = std::operator<<(output,"#ifndef ");
  poVar3 = std::operator<<(poVar3,(string *)local_1c0);
  poVar3 = std::operator<<(poVar3,"_H");
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(output,"#define ");
  poVar3 = std::operator<<(poVar3,(string *)local_1c0);
  poVar3 = std::operator<<(poVar3,"_H");
  this_00 = (ostream *)
            std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->m_systemIncludes);
  local_208._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->m_systemIncludes);
  while (bVar1 = std::operator!=(&__end1,&local_208), bVar1) {
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)&__range1_1,(string *)pbVar4);
    poVar3 = std::operator<<(output,"#include <");
    poVar3 = std::operator<<(poVar3,(string *)&__range1_1);
    poVar3 = std::operator<<(poVar3,">");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->m_localIncludes);
  local_240._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->m_localIncludes);
  while (bVar1 = std::operator!=(&__end1_1,&local_240), bVar1) {
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_1);
    std::__cxx11::string::string(local_260,(string *)pbVar4);
    poVar3 = std::operator<<(output,"#include \"");
    poVar3 = std::operator<<(poVar3,local_260);
    poVar3 = std::operator<<(poVar3,"\"");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_260);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  uVar5 = std::__cxx11::string::size();
  if (1 < uVar5) {
    poVar3 = std::operator<<(output,"namespace ");
    poVar3 = std::operator<<(poVar3,(string *)&this->m_namespace);
    poVar3 = std::operator<<(poVar3," {");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  }
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"/*",&local_281);
    pCVar7 = CodeBlock::addLine((CodeBlock *)local_1a0,(string *)local_280);
    std::__cxx11::string::string(local_2a8,(string *)&this->m_documentation);
    pCVar7 = CodeBlock::addLine(pCVar7,(string *)local_2a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"*/",&local_2c9);
    CodeBlock::addLine(pCVar7,(string *)local_2c8);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  std::operator+((char *)local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"class ");
  CodeBlock::addLine((CodeBlock *)local_1a0,local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  sVar8 = std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::size
                    (&this->m_parents);
  if (sVar8 != 0) {
    bVar1 = false;
    poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
    std::operator<<((ostream *)poVar9," : ");
    __end2 = std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::
             begin(&this->m_parents);
    parent._64_8_ =
         std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::end
                   (&this->m_parents);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cppgenerate::Class::Parent_*,_std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>_>
                                       *)&parent.field_0x40), bVar2) {
      pPVar10 = __gnu_cxx::
                __normal_iterator<const_cppgenerate::Class::Parent_*,_std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>_>
                ::operator*(&__end2);
      Parent::Parent((Parent *)local_358,pPVar10);
      if (bVar1) {
        poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
        std::operator<<((ostream *)poVar9,", ");
      }
      if (parent._24_4_ == 0) {
        poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
        std::operator<<((ostream *)poVar9,"public ");
      }
      else if (parent._24_4_ == 2) {
        poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
        std::operator<<((ostream *)poVar9,"protected ");
      }
      poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
      poVar3 = std::operator<<((ostream *)poVar9,(string *)local_358);
      std::operator<<(poVar3," ");
      bVar1 = true;
      Parent::~Parent((Parent *)local_358);
      __gnu_cxx::
      __normal_iterator<const_cppgenerate::Class::Parent_*,_std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>_>
      ::operator++(&__end2);
    }
  }
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  poVar3 = std::operator<<((ostream *)poVar9,"{");
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  if ((this->m_isQobject & 1U) != 0) {
    pCVar7 = CodeBlock::indent((CodeBlock *)local_1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_378,"Q_OBJECT",&local_379);
    pCVar7 = CodeBlock::addLine(pCVar7,(string *)local_378);
    CodeBlock::unindent(pCVar7);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
  }
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printConstructors(this,(ostream *)poVar9,PUBLIC,(bool)(~block._383_1_ & 1));
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printConstructors(this,(ostream *)poVar9,PROTECTED,(bool)(~block._383_1_ & 1));
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printConstructors(this,(ostream *)poVar9,PRIVATE,(bool)(~block._383_1_ & 1));
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printMethods(this,(ostream *)poVar9,PUBLIC,(bool)(~block._383_1_ & 1));
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printMethods(this,(ostream *)poVar9,PROTECTED,(bool)(~block._383_1_ & 1));
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printMethods(this,(ostream *)poVar9,PRIVATE,(bool)(~block._383_1_ & 1));
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printVariables(this,(ostream *)poVar9,PUBLIC);
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printVariables(this,(ostream *)poVar9,PROTECTED);
  poVar9 = CodeBlock::buffer_abi_cxx11_((CodeBlock *)local_1a0);
  printVariables(this,(ostream *)poVar9,PRIVATE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"};",&local_3a1);
  CodeBlock::addLine((CodeBlock *)local_1a0,(string *)local_3a0);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  CodeBlock::print((CodeBlock *)local_1a0,output);
  uVar5 = std::__cxx11::string::size();
  if (1 < uVar5) {
    poVar3 = std::operator<<(output,"} /* namespace ");
    poVar3 = std::operator<<(poVar3,(string *)&this->m_namespace);
    poVar3 = std::operator<<(poVar3," */");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<(output,"#endif /* ");
  poVar3 = std::operator<<(poVar3,(string *)local_1c0);
  poVar3 = std::operator<<(poVar3,"_H */");
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1c0);
  CodeBlock::~CodeBlock((CodeBlock *)local_1a0);
  return;
}

Assistant:

void Class::print( std::ostream& output, bool headerOnly ) const {
    cppgenerate::CodeBlock block;
    std::string classNameUpper = cppgenerate::uppercase( m_className );

    output << "#ifndef " << classNameUpper << "_H" << std::endl;
    output << "#define " << classNameUpper << "_H" << std::endl << std::endl;

    for( std::string include : m_systemIncludes ){
        output << "#include <" << include << ">" << std::endl;
    }

    for( std::string include : m_localIncludes ){
        output << "#include \"" << include << "\"" << std::endl;
    }

    if( m_namespace.size() > 1 ){
        output << "namespace " << m_namespace << " {" << std::endl;
    }

    if( m_documentation.size() > 0 ){
        block.addLine( "/*" )
            .addLine( m_documentation )
            .addLine( "*/" );
    }
    block.addLine( "class " + m_className );

    if( m_parents.size() > 0 ){
        bool comma = false;
        block.buffer() << " : ";
        for( Parent parent : m_parents ){
            if( comma ) block.buffer() << ", ";
            switch( parent.inheritanceType ){
            case cppgenerate::AccessModifier::PUBLIC:
                block.buffer() << "public ";
                break;
            case cppgenerate::AccessModifier::PROTECTED:
                block.buffer() << "protected ";
                break;
            default:
                break;
            }
            block.buffer() << parent.parentName << " ";
            comma = true;
        }
    }

    block.buffer() << "{" << std::endl;

    if( m_isQobject ){
        block.indent()
            .addLine( "Q_OBJECT" )
            .unindent();
    }


    printConstructors( block.buffer(), AccessModifier::PUBLIC, !headerOnly );
    printConstructors( block.buffer(), AccessModifier::PROTECTED, !headerOnly );
    printConstructors( block.buffer(), AccessModifier::PRIVATE, !headerOnly );

    printMethods( block.buffer(), AccessModifier::PUBLIC, !headerOnly );
    printMethods( block.buffer(), AccessModifier::PROTECTED, !headerOnly );
    printMethods( block.buffer(), AccessModifier::PRIVATE, !headerOnly );

    printVariables( block.buffer(), AccessModifier::PUBLIC );
    printVariables( block.buffer(), AccessModifier::PROTECTED );
    printVariables( block.buffer(), AccessModifier::PRIVATE );


    block.addLine( "};" );

    block.print( output );

    if( m_namespace.size() > 1 ){
        output << "} /* namespace " << m_namespace << " */" << std::endl;
    }

    output << "#endif /* " << classNameUpper << "_H */" << std::endl;
}